

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<int> * __thiscall
QMainWindowLayoutState::gapIndex(QMainWindowLayoutState *this,QWidget *widget,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  QToolBar *pQVar3;
  QDockWidget *pQVar4;
  QDockWidgetGroupWindow *pQVar5;
  QDockWidgetGroupWindow *in_RCX;
  undefined8 in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *group;
  bool disallowTabs;
  QList<int> *result;
  parameter_type pVar6;
  QPoint *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  uint3 in_stack_ffffffffffffffa4;
  uint uVar7;
  undefined1 disallowTabs_00;
  QPoint *pos_00;
  QDockAreaLayout *in_stack_ffffffffffffffc8;
  
  disallowTabs_00 = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (uint)in_stack_ffffffffffffffa4;
  *in_RDI = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[2] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pos_00 = in_RDI;
  QList<int>::QList((QList<int> *)0x5f3ec0);
  pQVar3 = qobject_cast<QToolBar*>((QObject *)0x5f3eca);
  if (pQVar3 == (QToolBar *)0x0) {
    pQVar4 = qobject_cast<QDockWidget*>((QObject *)0x5f3f34);
    if ((pQVar4 != (QDockWidget *)0x0) ||
       (pQVar5 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f3f44),
       pQVar5 != (QDockWidgetGroupWindow *)0x0)) {
      pQVar5 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f3f5d);
      if (pQVar5 != (QDockWidgetGroupWindow *)0x0) {
        QDockWidgetGroupWindow::tabLayoutInfo(in_RCX);
      }
      QDockAreaLayout::gapIndex(in_stack_ffffffffffffffc8,pos_00,(bool)disallowTabs_00);
      QList<int>::operator=((QList<int> *)this_00,(QList<int> *)in_RDI);
      pVar6 = (parameter_type)((ulong)in_RDI >> 0x20);
      QList<int>::~QList((QList<int> *)0x5f3fbd);
      bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3fc6);
      if (!bVar2) {
        QList<int>::prepend((QList<int> *)0x5f3fd8,pVar6);
      }
    }
  }
  else {
    QToolBarAreaLayout::gapIndex
              ((QToolBarAreaLayout *)CONCAT44(uVar7,in_stack_ffffffffffffffa0),
               (QPoint *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QList<int>::operator=((QList<int> *)this_00,(QList<int> *)in_RDI);
    pVar6 = (parameter_type)((ulong)in_RDI >> 0x20);
    QList<int>::~QList((QList<int> *)0x5f3f00);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3f09);
    if (!bVar2) {
      QList<int>::prepend((QList<int> *)0x5f3f18,pVar6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<int> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutState::gapIndex(QWidget *widget,
                                            const QPoint &pos) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (qobject_cast<QToolBar*>(widget) != nullptr) {
        result = toolBarAreaLayout.gapIndex(pos);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) != nullptr
            || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        bool disallowTabs = false;
#if QT_CONFIG(tabbar)
        if (auto *group = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            if (!group->tabLayoutInfo()) // Disallow to drop nested docks as a tab
                disallowTabs = true;
        }
#endif
        result = dockAreaLayout.gapIndex(pos, disallowTabs);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}